

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O3

bool __thiscall
NNTreeIterator::deepen(NNTreeIterator *this,QPDFObjectHandle *node,bool first,bool allow_empty)

{
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *this_00;
  size_t *psVar1;
  QPDF *pQVar2;
  QPDFObjectHandle *oh;
  char cVar3;
  NNTreeIterator *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  uint uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QPDFObjGen QVar8;
  _Node *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long *plVar11;
  undefined7 in_register_00000009;
  size_type *psVar12;
  element_type *peVar13;
  undefined7 in_register_00000011;
  iterator __end1;
  uint __val;
  uint uVar14;
  uint uVar16;
  _List_node_base *p_Var17;
  QPDFObjectHandle kids;
  QPDFObjectHandle items;
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> opath;
  set seen;
  string local_158;
  NNTreeIterator *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined4 local_10c;
  QPDFObjectHandle local_108;
  long *local_f0 [2];
  long local_e0 [2];
  ulong local_d0;
  undefined4 local_c4;
  QPDFObjectHandle local_c0;
  QPDF *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_a8;
  element_type *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  QPDFObjectHandle local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_80;
  _List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> local_78;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_60;
  ulong uVar15;
  
  local_c4 = (undefined4)CONCAT71(in_register_00000009,allow_empty);
  local_10c = (undefined4)CONCAT71(in_register_00000011,first);
  this_00 = &this->path;
  local_138 = this;
  std::__cxx11::list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
  list((list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *)&local_78,
       this_00);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var17 = (_List_node_base *)this_00;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var17 = (((_List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                      *)&p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var17 != (_List_node_base *)this_00) {
    QVar8 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)(p_Var17 + 1));
    QPDFObjGen::set::add((set *)&local_60,QVar8);
  }
  local_80 = &(local_138->node).super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_a8 = &(node->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_d0 = 0;
  do {
    paVar10 = &local_158.field_2;
    if ((local_d0 & 1) != 0) goto LAB_0012b87d;
    QVar8 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&node->super_BaseHandle);
    bVar5 = QPDFObjGen::set::add((set *)&local_60,QVar8);
    if (!bVar5) {
      pQVar2 = local_138->impl->qpdf;
      local_158._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"loop detected while traversing name/number tree","");
      warn(pQVar2,node,&local_158);
LAB_0012b867:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != paVar10) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0012b87d;
    }
    bVar5 = QPDFObjectHandle::isDictionary(node);
    if (!bVar5) {
      pQVar2 = local_138->impl->qpdf;
      local_158._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"non-dictionary node while traversing name/number tree","");
      warn(pQVar2,node,&local_158);
      goto LAB_0012b867;
    }
    local_158._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Kids","");
    QPDFObjectHandle::getKey(&local_c0,(string *)node);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar10) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    bVar5 = QPDFObjectHandle::isArray(&local_c0);
    iVar6 = 0;
    if (bVar5) {
      iVar6 = QPDFObjectHandle::getArrayNItems(&local_c0);
    }
    (*(code *)**(undefined8 **)local_138->impl->details)();
    QPDFObjectHandle::getKey(&local_90,(string *)node);
    bVar5 = QPDFObjectHandle::isArray(&local_90);
    if ((bVar5) && (iVar7 = QPDFObjectHandle::getArrayNItems(&local_90), 0 < iVar7)) {
      iVar7 = iVar7 + -2;
      if ((char)local_10c != '\0') {
        iVar7 = 0;
      }
LAB_0012b1c1:
      this_01 = local_138;
      (local_138->node).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_80,local_a8);
      this_01->item_number = iVar7;
      updateIValue(this_01,true);
LAB_0012b427:
      bVar5 = false;
    }
    else {
      if (iVar6 < 1) {
        if ((char)local_c4 != '\0') {
          bVar5 = QPDFObjectHandle::isArray(&local_90);
          iVar7 = -1;
          if (bVar5) goto LAB_0012b1c1;
        }
        pQVar2 = local_138->impl->qpdf;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(code *)**(undefined8 **)local_138->impl->details)();
        std::operator+(&local_130,"name/number tree node has neither non-empty ",__rhs);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_130);
        psVar12 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_158.field_2._M_allocated_capacity = *psVar12;
          local_158.field_2._8_8_ = plVar11[3];
          local_158._M_dataplus._M_p = (pointer)paVar10;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar12;
          local_158._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_158._M_string_length = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        warn(pQVar2,node,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar10) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        paVar10 = &local_130.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar10) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          paVar10 = extraout_RAX;
        }
        local_d0 = CONCAT71((int7)((ulong)paVar10 >> 8),1);
        goto LAB_0012b427;
      }
      __val = iVar6 - 1;
      uVar15 = (ulong)__val;
      if ((char)local_10c != '\0') {
        __val = 0;
      }
      local_158._M_dataplus._M_p._0_4_ = __val;
      p_Var9 = std::__cxx11::
               list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>>::
               _M_create_node<QPDFObjectHandle_const&,int&>
                         ((list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>>
                           *)this_00,node,(int *)&local_158);
      std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
      psVar1 = &(local_138->path).
                super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      QPDFObjectHandle::getArrayItem(&local_108,(int)&local_c0);
      bVar5 = QPDFObjectHandle::isIndirect(&local_108);
      if (!bVar5) {
        local_b0 = local_138->impl->qpdf;
        cVar3 = (char)((int)__val >> 0x1f);
        if (local_138->impl->auto_repair == true) {
          uVar16 = 1;
          if (9 < __val) {
            uVar4 = 4;
            do {
              uVar16 = uVar4;
              uVar14 = (uint)uVar15;
              if (uVar14 < 100) {
                uVar16 = uVar16 - 2;
                goto LAB_0012b440;
              }
              if (uVar14 < 1000) {
                uVar16 = uVar16 - 1;
                goto LAB_0012b440;
              }
              if (uVar14 < 10000) goto LAB_0012b440;
              uVar15 = uVar15 / 10000;
              uVar4 = uVar16 + 4;
            } while (99999 < uVar14);
            uVar16 = uVar16 + 1;
          }
LAB_0012b440:
          local_f0[0] = local_e0;
          std::__cxx11::string::_M_construct((ulong)local_f0,(char)uVar16 - cVar3);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(__val >> 0x1f) + (long)local_f0[0]),uVar16,__val);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x25e441);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar10) {
            local_130.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_130.field_2._8_8_ = plVar11[3];
          }
          else {
            local_130.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_130._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_130._M_string_length = plVar11[1];
          *plVar11 = (long)paVar10;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_130);
          peVar13 = (element_type *)(plVar11 + 2);
          if ((element_type *)*plVar11 == peVar13) {
            local_158.field_2._M_allocated_capacity =
                 *(undefined8 *)
                  &(peVar13->value).
                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ;
            local_158.field_2._8_8_ = plVar11[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity =
                 *(undefined8 *)
                  &(peVar13->value).
                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ;
            local_158._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_158._M_string_length = plVar11[1];
          *plVar11 = (long)peVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          warn(local_b0,node,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if (local_f0[0] != local_e0) {
            operator_delete(local_f0[0],local_e0[0] + 1);
          }
          oh = (QPDFObjectHandle *)local_138->impl->qpdf;
          local_a0 = local_108.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_98 = local_108.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_108.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_108.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_108.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_108.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_108.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          QPDF::makeIndirectObject((QPDF *)&local_158,oh);
          this_02._M_pi =
               local_108.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length;
          local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_158._M_dataplus._M_p;
          local_158._M_dataplus._M_p = (pointer)0x0;
          local_158._M_string_length = 0;
          if ((this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
          }
          if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
          }
          QPDFObjectHandle::setArrayItem(&local_c0,__val,&local_108);
        }
        else {
          uVar16 = 1;
          if (9 < __val) {
            uVar4 = 4;
            do {
              uVar16 = uVar4;
              uVar14 = (uint)uVar15;
              if (uVar14 < 100) {
                uVar16 = uVar16 - 2;
                goto LAB_0012b63e;
              }
              if (uVar14 < 1000) {
                uVar16 = uVar16 - 1;
                goto LAB_0012b63e;
              }
              if (uVar14 < 10000) goto LAB_0012b63e;
              uVar15 = uVar15 / 10000;
              uVar4 = uVar16 + 4;
            } while (99999 < uVar14);
            uVar16 = uVar16 + 1;
          }
LAB_0012b63e:
          local_f0[0] = local_e0;
          std::__cxx11::string::_M_construct((ulong)local_f0,(char)uVar16 - cVar3);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(__val >> 0x1f) + (long)local_f0[0]),uVar16,__val);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x25e44c);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar10) {
            local_130.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_130.field_2._8_8_ = plVar11[3];
          }
          else {
            local_130.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_130._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_130._M_string_length = plVar11[1];
          *plVar11 = (long)paVar10;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_130);
          psVar12 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_158.field_2._M_allocated_capacity = *psVar12;
            local_158.field_2._8_8_ = plVar11[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar12;
            local_158._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_158._M_string_length = plVar11[1];
          *plVar11 = (long)psVar12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          warn(local_b0,node,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if (local_f0[0] != local_e0) {
            operator_delete(local_f0[0],local_e0[0] + 1);
          }
        }
      }
      (node->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_108.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (local_a8,&local_108.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      bVar5 = true;
    }
    if (local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  } while (bVar5);
  bVar5 = true;
  if ((local_d0 & 1) != 0) {
LAB_0012b87d:
    if (&this_00->
         super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
        != &local_78) {
      std::__cxx11::list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>>::
      _M_assign_dispatch<std::_List_const_iterator<NNTreeIterator::PathElement>>
                ((list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>> *)
                 this_00,local_78._M_impl._M_node.super__List_node_base._M_next);
    }
    bVar5 = false;
  }
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_60);
  std::__cxx11::
  _List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::_M_clear
            (&local_78);
  return bVar5;
}

Assistant:

bool
NNTreeIterator::deepen(QPDFObjectHandle node, bool first, bool allow_empty)
{
    // Starting at this node, descend through the first or last kid until we reach a node with
    // items. If we succeed, return true; otherwise return false and leave path alone.

    auto opath = this->path;
    bool failed = false;

    QPDFObjGen::set seen;
    for (auto const& i: this->path) {
        seen.add(i.node);
    }
    while (!failed) {
        if (!seen.add(node)) {
            QTC::TC("qpdf", "NNTree deepen: loop");
            warn(impl.qpdf, node, "loop detected while traversing name/number tree");
            failed = true;
            break;
        }

        if (!node.isDictionary()) {
            QTC::TC("qpdf", "NNTree node is not a dictionary");
            warn(impl.qpdf, node, "non-dictionary node while traversing name/number tree");
            failed = true;
            break;
        }

        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(impl.details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;
        if (nitems > 0) {
            setItemNumber(node, first ? 0 : nitems - 2);
            break;
        } else if (nkids > 0) {
            int kid_number = first ? 0 : nkids - 1;
            addPathElement(node, kid_number);
            auto next = kids.getArrayItem(kid_number);
            if (!next.isIndirect()) {
                if (impl.auto_repair) {
                    QTC::TC("qpdf", "NNTree fix indirect kid");
                    warn(
                        impl.qpdf,
                        node,
                        ("converting kid number " + std::to_string(kid_number) +
                         " to an indirect object"));
                    next = impl.qpdf.makeIndirectObject(next);
                    kids.setArrayItem(kid_number, next);
                } else {
                    QTC::TC("qpdf", "NNTree warn indirect kid");
                    warn(
                        impl.qpdf,
                        node,
                        ("kid number " + std::to_string(kid_number) +
                         " is not an indirect object"));
                }
            }
            node = next;
        } else if (allow_empty && items.isArray()) {
            QTC::TC("qpdf", "NNTree deepen found empty");
            setItemNumber(node, -1);
            break;
        } else {
            QTC::TC("qpdf", "NNTree deepen: invalid node");
            warn(
                impl.qpdf,
                node,
                ("name/number tree node has neither non-empty " + impl.details.itemsKey() +
                 " nor /Kids"));
            failed = true;
            break;
        }
    }
    if (failed) {
        this->path = opath;
        return false;
    }
    return true;
}